

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<long,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  char *pcVar3;
  char *pcVar4;
  idx_t iVar5;
  int iVar6;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar5 = 0;
    do {
      pcVar3 = *(char **)(pdVar1 + iVar5 * 8);
      if (*pcVar3 == '\x01') {
        pcVar4 = *(char **)(pdVar2 + iVar5 * 8);
        if (*pcVar4 == '\0') {
          iVar6 = *(int *)(pcVar3 + 0x10);
        }
        else {
          iVar6 = *(int *)(pcVar3 + 0x10);
          if (*(int *)(pcVar4 + 0x10) <= iVar6) goto LAB_01943764;
        }
        *(undefined8 *)(pcVar4 + 8) = *(undefined8 *)(pcVar3 + 8);
        *(int *)(pcVar4 + 0x10) = iVar6;
        *pcVar4 = '\x01';
      }
LAB_01943764:
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}